

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_service.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cxx::ServiceGenerator::GenerateInterface
          (ServiceGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  
  variables = &this->vars_;
  io::Printer::Print(printer,variables,
                     "class $dllexport$$classname$ : public ::google::protobuf::rpc::Service {\n protected:\n  // This class should be treated as an abstract interface.\n  inline $classname$() {};\n public:\n  virtual ~$classname$();\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Print(printer,variables,
                     "\ntypedef $classname$_Stub Stub;\n\nstatic const ::google::protobuf::ServiceDescriptor* descriptor();\n\n"
                    );
  GenerateMethodSignatures(this,VIRTUAL,printer);
  io::Printer::Print(printer,
                     "\n// implements Service ----------------------------------------------\n\nconst ::google::protobuf::ServiceDescriptor* GetDescriptor();\nconst ::google::protobuf::rpc::Error CallMethod(\n  const ::google::protobuf::MethodDescriptor* method,\n  const ::google::protobuf::Message* request,\n  ::google::protobuf::Message* response);\nconst ::google::protobuf::Message& GetRequestPrototype(\n  const ::google::protobuf::MethodDescriptor* method) const;\nconst ::google::protobuf::Message& GetResponsePrototype(\n  const ::google::protobuf::MethodDescriptor* method) const;\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,variables,
                     "\n private:\n  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n};\n\n");
  return;
}

Assistant:

void ServiceGenerator::GenerateInterface(io::Printer* printer) {
  printer->Print(vars_,
    "class $dllexport$$classname$ : public ::google::protobuf::rpc::Service {\n"
    " protected:\n"
    "  // This class should be treated as an abstract interface.\n"
    "  inline $classname$() {};\n"
    " public:\n"
    "  virtual ~$classname$();\n");
  printer->Indent();

  printer->Print(vars_,
    "\n"
    "typedef $classname$_Stub Stub;\n"
    "\n"
    "static const ::google::protobuf::ServiceDescriptor* descriptor();\n"
    "\n");

  GenerateMethodSignatures(VIRTUAL, printer);

  printer->Print(
    "\n"
    "// implements Service ----------------------------------------------\n"
    "\n"
    "const ::google::protobuf::ServiceDescriptor* GetDescriptor();\n"
    "const ::google::protobuf::rpc::Error CallMethod(\n"
    "  const ::google::protobuf::MethodDescriptor* method,\n"
    "  const ::google::protobuf::Message* request,\n"
    "  ::google::protobuf::Message* response);\n"
    "const ::google::protobuf::Message& GetRequestPrototype(\n"
    "  const ::google::protobuf::MethodDescriptor* method) const;\n"
    "const ::google::protobuf::Message& GetResponsePrototype(\n"
    "  const ::google::protobuf::MethodDescriptor* method) const;\n");

  printer->Outdent();
  printer->Print(vars_,
    "\n"
    " private:\n"
    "  GOOGLE_DISALLOW_EVIL_CONSTRUCTORS($classname$);\n"
    "};\n"
    "\n");
}